

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<vector<int>_> * __thiscall
vector<vector<int>_>::operator=(vector<vector<int>_> *this,vector<vector<int>_> *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  vector<int> *pvVar5;
  ulong uVar6;
  vector<int> *local_50;
  int local_28 [2];
  int i;
  vector<vector<int>_> *local_18;
  vector<vector<int>_> *other_local;
  vector<vector<int>_> *this_local;
  
  this->_size = other->_size;
  this->_capacity = other->_capacity;
  uVar2 = (ulong)this->_capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  local_18 = other;
  other_local = this;
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pvVar5 = (vector<int> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_50 = pvVar5;
    do {
      vector<int>::vector(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pvVar5 + uVar2);
  }
  this->vect = pvVar5;
  for (local_28[0] = 0; local_28[0] < this->_size; local_28[0] = local_28[0] + 1) {
    pvVar5 = operator[](local_18,local_28);
    vector<int>::operator=(this->vect + local_28[0],pvVar5);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }